

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O0

shared_ptr<hrgls_StreamProperties_> __thiscall
hrgls::StreamProperties::GetRawProperties(StreamProperties *this)

{
  bool bVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  __shared_ptr *in_RSI;
  shared_ptr<hrgls_StreamProperties_> sVar4;
  StreamProperties *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)in_RSI);
    std::shared_ptr<hrgls_StreamProperties_>::shared_ptr
              ((shared_ptr<hrgls_StreamProperties_> *)this,&peVar2->m_state);
    _Var3._M_pi = extraout_RDX_00;
  }
  else {
    std::shared_ptr<hrgls_StreamProperties_>::shared_ptr
              ((shared_ptr<hrgls_StreamProperties_> *)this,(nullptr_t)0x0);
    _Var3._M_pi = extraout_RDX;
  }
  sVar4.super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<hrgls_StreamProperties_>)
         sVar4.super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<hrgls_StreamProperties_> StreamProperties::GetRawProperties() const
  {
    if (!m_private) {
      return nullptr;
    }
    return m_private->m_state;
  }